

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void absl::lts_20250127::log_internal::FlushLogSinks(void)

{
  GlobalLogSinkSet *this;
  
  this = anon_unknown_0::GlobalSinks();
  anon_unknown_0::GlobalLogSinkSet::FlushLogSinks(this);
  return;
}

Assistant:

void FlushLogSinks() { log_internal::GlobalSinks().FlushLogSinks(); }